

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::Array<kj::(anonymous_namespace)::TestObject>::~Array
          (Array<kj::(anonymous_namespace)::TestObject> *this)

{
  TestObject *pTVar1;
  size_t sVar2;
  
  pTVar1 = this->ptr;
  if (pTVar1 != (TestObject *)0x0) {
    sVar2 = this->size_;
    this->ptr = (TestObject *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pTVar1,4,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::(anonymous_namespace)::TestObject>::destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }